

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall ClipperLib::Clipper::IsTopHorz(Clipper *this,long64 XPos)

{
  long lVar1;
  TEdge *pTVar2;
  long lVar3;
  long lVar4;
  
  pTVar2 = this->m_SortedEdges;
  if (pTVar2 != (TEdge *)0x0) {
    do {
      lVar1 = pTVar2->xcurr;
      lVar3 = pTVar2->xtop;
      lVar4 = lVar1;
      if (lVar3 < lVar1) {
        lVar4 = lVar3;
      }
      if (lVar3 < lVar1) {
        lVar3 = lVar1;
      }
    } while ((lVar3 < XPos || XPos < lVar4) && (pTVar2 = pTVar2->nextInSEL, pTVar2 != (TEdge *)0x0))
    ;
    return lVar3 < XPos || XPos < lVar4;
  }
  return true;
}

Assistant:

bool Clipper::IsTopHorz(const long64 XPos)
{
  TEdge* e = m_SortedEdges;
  while( e )
  {
    if(  ( XPos >= std::min(e->xcurr, e->xtop) ) &&
      ( XPos <= std::max(e->xcurr, e->xtop) ) ) return false;
    e = e->nextInSEL;
  }
  return true;
}